

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownLikeFilter
          (FilterCombiner *this,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  BoundFunctionExpression *pBVar6;
  reference pvVar7;
  pointer pEVar8;
  BoundColumnRefExpression *pBVar9;
  BoundConstantExpression *pBVar10;
  const_reference pvVar11;
  TableFilter *this_00;
  string *psVar12;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_01;
  long lVar13;
  bool bVar14;
  FilterPushdownResult FVar15;
  bool bVar16;
  templated_unique_single_t lower_bound;
  templated_unique_single_t upper_bound;
  string prefix;
  ExpressionType local_129;
  TableFilter *local_128;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_120;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_118;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_110;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_108;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  const_reference local_d8;
  Value local_d0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((expr->super_BaseExpression).expression_class != BOUND_FUNCTION) {
    return NO_PUSHDOWN;
  }
  pBVar6 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&expr->super_BaseExpression);
  iVar5 = ::std::__cxx11::string::compare
                    ((char *)&(pBVar6->function).super_BaseScalarFunction.super_SimpleFunction.
                              super_Function.name);
  if (iVar5 != 0) {
    return NO_PUSHDOWN;
  }
  this_01 = &pBVar6->children;
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_01,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  if ((pEVar8->super_BaseExpression).expression_class != BOUND_COLUMN_REF) {
    return NO_PUSHDOWN;
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_01,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  if ((pEVar8->super_BaseExpression).type != VALUE_CONSTANT) {
    return NO_PUSHDOWN;
  }
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_01,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  pBVar9 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar8->super_BaseExpression);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_01,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  pBVar10 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&pEVar8->super_BaseExpression);
  pvVar11 = vector<duckdb::ColumnIndex,_true>::operator[](column_ids,(pBVar9->binding).column_index)
  ;
  if ((pBVar10->value).is_null == true) {
    this_00 = (TableFilter *)operator_new(0x10);
    IsNotNullFilter::IsNotNullFilter((IsNotNullFilter *)this_00);
    local_100._M_head_impl = this_00;
    TableFilterSet::PushFilter
              (table_filters,pvVar11,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_100);
    if (local_100._M_head_impl != (TableFilter *)0x0) {
      (*((TableFilter *)&(local_100._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])();
    }
    return PUSHED_DOWN_FULLY;
  }
  psVar12 = StringValue::Get_abi_cxx11_(&pBVar10->value);
  cVar1 = *(psVar12->_M_dataplus)._M_p;
  if (cVar1 == '%') {
    return NO_PUSHDOWN;
  }
  if (cVar1 == '_') {
    return NO_PUSHDOWN;
  }
  local_f8 = local_e8;
  local_f0 = 0;
  local_e8[0] = 0;
  sVar2 = psVar12->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (psVar12->_M_dataplus)._M_p;
    lVar13 = 0;
    local_d8 = pvVar11;
    bVar14 = true;
    do {
      cVar1 = pcVar3[lVar13];
      bVar16 = true;
      bVar4 = false;
      if ((cVar1 != '%') && (cVar1 != '_')) {
        ::std::__cxx11::string::push_back((char)&local_f8);
        bVar16 = false;
        bVar4 = bVar14;
      }
      pvVar11 = local_d8;
    } while ((!bVar16) &&
            (bVar16 = sVar2 - 1 != lVar13, lVar13 = lVar13 + 1, bVar14 = bVar4, bVar16));
    if (!bVar4) {
      local_120._M_head_impl._0_1_ = 0x1e;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_f8,local_f8 + local_f0);
      Value::Value(&local_d0,&local_70);
      make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
                ((duckdb *)&local_128,(ExpressionType *)&local_120,&local_d0);
      Value::~Value(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_f8[local_f0 + -1] = local_f8[local_f0 + -1] + '\x01';
      local_129 = COMPARE_LESSTHAN;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_f8,local_f8 + local_f0);
      Value::Value(&local_d0,&local_90);
      make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
                ((duckdb *)&local_120,&local_129,&local_d0);
      Value::~Value(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      local_110._M_head_impl = local_128;
      local_128 = (TableFilter *)0x0;
      TableFilterSet::PushFilter
                (table_filters,pvVar11,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_110);
      if (local_110._M_head_impl != (TableFilter *)0x0) {
        (*(local_110._M_head_impl)->_vptr_TableFilter[1])();
      }
      local_118._M_head_impl = local_120._M_head_impl;
      local_110._M_head_impl = (TableFilter *)0x0;
      local_120._M_head_impl = (TableFilter *)0x0;
      TableFilterSet::PushFilter
                (table_filters,pvVar11,
                 (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
                 &local_118);
      if (local_118._M_head_impl != (TableFilter *)0x0) {
        (*(local_118._M_head_impl)->_vptr_TableFilter[1])();
      }
      local_118._M_head_impl = (TableFilter *)0x0;
      if (local_120._M_head_impl != (TableFilter *)0x0) {
        (*(local_120._M_head_impl)->_vptr_TableFilter[1])();
      }
      if (local_128 != (TableFilter *)0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
      FVar15 = PUSHED_DOWN_PARTIALLY;
      goto LAB_00d5c3c9;
    }
  }
  local_120._M_head_impl._0_1_ = 0x19;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_f8,local_f8 + local_f0);
  Value::Value(&local_d0,&local_50);
  make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType,duckdb::Value>
            ((duckdb *)&local_128,(ExpressionType *)&local_120,&local_d0);
  Value::~Value(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_108._M_head_impl = local_128;
  local_128 = (TableFilter *)0x0;
  TableFilterSet::PushFilter
            (table_filters,pvVar11,
             (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
             &local_108);
  if (local_108._M_head_impl != (TableFilter *)0x0) {
    (*(local_108._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_108._M_head_impl = (TableFilter *)0x0;
  if (local_128 != (TableFilter *)0x0) {
    (**(code **)(*(long *)local_128 + 8))();
  }
  FVar15 = PUSHED_DOWN_FULLY;
LAB_00d5c3c9:
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return FVar15;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownLikeFilter(TableFilterSet &table_filters,
                                                           const vector<ColumnIndex> &column_ids, Expression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::BOUND_FUNCTION) {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	auto &func = expr.Cast<BoundFunctionExpression>();
	if (func.function.name != "~~") {
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	if (func.children[0]->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF ||
	    func.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
		// we need col LIKE 'literal' in order to generate extra filters
		return FilterPushdownResult::NO_PUSHDOWN;
	}

	//! This is a like function.
	auto &column_ref = func.children[0]->Cast<BoundColumnRefExpression>();
	auto &constant_value_expr = func.children[1]->Cast<BoundConstantExpression>();
	auto &column_index = column_ids[column_ref.binding.column_index];
	// constant value expr can sometimes be null. if so, push is not null filter, which will
	// make the filter unsatisfiable and return no results.
	if (constant_value_expr.value.IsNull()) {
		auto is_not_null = make_uniq<IsNotNullFilter>();
		table_filters.PushFilter(column_index, std::move(is_not_null));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}
	auto &like_string = StringValue::Get(constant_value_expr.value);
	if (like_string[0] == '%' || like_string[0] == '_') {
		//! If the like starts with a special character we have no fixed prefix so nothing to pushdown
		return FilterPushdownResult::NO_PUSHDOWN;
	}
	string prefix;
	bool equality = true;
	for (char const &c : like_string) {
		if (c == '%' || c == '_') {
			equality = false;
			break;
		}
		prefix += c;
	}
	if (equality) {
		//! If the LIKE has no special characters we can turn it into an equality and push that down
		auto equal_filter = make_uniq<ConstantFilter>(ExpressionType::COMPARE_EQUAL, Value(prefix));
		table_filters.PushFilter(column_index, std::move(equal_filter));
		return FilterPushdownResult::PUSHED_DOWN_FULLY;
	}

	//! We have a prefix - we can push down the prefix using a bound (x >= PREFIX AND x <= prefix + 1)
	// Note that we still need to execute the LIKE filter
	auto lower_bound = make_uniq<ConstantFilter>(ExpressionType::COMPARE_GREATERTHANOREQUALTO, Value(prefix));
	prefix[prefix.size() - 1]++;
	auto upper_bound = make_uniq<ConstantFilter>(ExpressionType::COMPARE_LESSTHAN, Value(prefix));
	table_filters.PushFilter(column_index, std::move(lower_bound));
	table_filters.PushFilter(column_index, std::move(upper_bound));
	return FilterPushdownResult::PUSHED_DOWN_PARTIALLY;
}